

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageBitAnd(StackInterpreter *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar4;
  ulong uVar5;
  ulong uVar6;
  Oop OVar7;
  int cb;
  int ca;
  SmallIntegerValue ib;
  SmallIntegerValue ia;
  Oop b;
  Oop a;
  StackInterpreter *this_local;
  
  paVar4 = &stackOopAt(this,1)->field_0;
  b.field_0 = *paVar4;
  paVar4 = &stackOopAt(this,0)->field_0;
  ia = paVar4->intValue;
  bVar1 = Oop::isSmallInteger(&b);
  if ((bVar1) && (bVar1 = Oop::isSmallInteger((Oop *)&ia), bVar1)) {
    fetchNextInstructionOpcode(this);
    popMultiplesOops(this,2);
    uVar5 = Oop::decodeSmallInteger(&b);
    uVar6 = Oop::decodeSmallInteger((Oop *)&ia);
    OVar7 = Oop::encodeSmallInteger(uVar5 & uVar6);
    pushOop(this,OVar7);
  }
  else {
    bVar1 = Oop::isCharacter(&b);
    if ((bVar1) && (bVar1 = Oop::isCharacter((Oop *)&ia), bVar1)) {
      fetchNextInstructionOpcode(this);
      popMultiplesOops(this,2);
      uVar2 = Oop::decodeCharacter(&b);
      uVar3 = Oop::decodeCharacter((Oop *)&ia);
      OVar7 = Oop::encodeCharacter(uVar2 & uVar3);
      pushOop(this,OVar7);
    }
    else {
      sendSpecialArgumentCount(this,BitAnd,1);
    }
  }
  return;
}

Assistant:

void interpretSpecialMessageBitAnd()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            pushOop(Oop::encodeSmallInteger(ia & ib));
        }
        else if(a.isCharacter() && b.isCharacter())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ca = a.decodeCharacter();
            auto cb = b.decodeCharacter();
            pushOop(Oop::encodeCharacter(ca & cb));
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::BitAnd, 1);
        }
    }